

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::VerifyByteCodeUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,
          BVSparse<Memory::JitArenaAllocator> *trackingByteCodeUpwardExposedUsed,Instr *instr,
          uint32 bytecodeOffset)

{
  Type TVar1;
  JitArenaAllocator *alloc;
  Type_conflict pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  ulong uVar7;
  char *this_01;
  ulong uVar8;
  
  this_01 = (char *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22cf,"(instr)","instr");
    if (!bVar4) goto LAB_003dc59b;
    *puVar5 = 0;
  }
  if (bytecodeOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22d0,"(bytecodeOffset != Js::Constants::NoByteCodeOffset)",
                       "bytecodeOffset != Js::Constants::NoByteCodeOffset");
    if (!bVar4) goto LAB_003dc59b;
    *puVar5 = 0;
  }
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22d1,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase"
                      );
    if (!bVar4) goto LAB_003dc59b;
    *puVar5 = 0;
  }
  pBVar6 = trackingByteCodeUpwardExposedUsed;
  if (trackingByteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    do {
      pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)pBVar6->head;
      if (pBVar6 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return;
      }
    } while (((Type *)&pBVar6->alloc)->word == 0);
    if ((this->func->field_0x240 & 0x10) != 0) {
      bv2 = GetByteCodeRegisterUpwardExposed((BackwardPass *)this_01,block,func,this->tempAlloc);
      alloc = this->tempAlloc;
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
      this_00->head = (Type_conflict)0x0;
      this_00->lastFoundIndex = (Type_conflict)0x0;
      this_00->alloc = alloc;
      this_00->lastUsedNodePrevNextField = (Type)this_00;
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (this_00,trackingByteCodeUpwardExposedUsed,bv2);
      pBVar6 = this_00;
      do {
        pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)pBVar6->head;
        if (pBVar6 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003dc575;
      } while (((Type *)&pBVar6->alloc)->word == 0);
      Output::Print(L"\n\nByteCode Updward Exposed mismatch after DeadStore\n");
      Output::Print(L"Mismatch Instr:\n");
      IR::Instr::Dump(instr);
      Output::Print(
                   L"  ByteCode Register list present before Backward pass missing in DeadStore pass:\n"
                   );
      for (pBVar2 = this_00->head; pBVar2 != (Type_conflict)0x0; pBVar2 = pBVar2->next) {
        uVar7 = (pBVar2->data).word;
        if (uVar7 != 0) {
          TVar1 = pBVar2->startIndex;
          uVar8 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar8);
            uVar7 = uVar7 & ~(1L << (uVar8 & 0x3f));
            Output::Print(L"    R%u\n",(ulong)((BVIndex)uVar8 + TVar1));
            uVar8 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
          } while (uVar7 != 0);
        }
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x22e8,"(false)","ByteCode Updward Exposed Used Mismatch");
      if (bVar4) {
        *puVar5 = 0;
LAB_003dc575:
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (this->tempAlloc,this_00);
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (this->tempAlloc,bv2);
        return;
      }
LAB_003dc59b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  return;
}

Assistant:

void
BackwardPass::VerifyByteCodeUpwardExposed(BasicBlock* block, Func* func, BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed, IR::Instr* instr, uint32 bytecodeOffset)
{
    Assert(instr);
    Assert(bytecodeOffset != Js::Constants::NoByteCodeOffset);
    Assert(this->tag == Js::DeadStorePhase);

    // The calculated bytecode upward exposed should be the same between Backward and DeadStore passes
    if (trackingByteCodeUpwardExposedUsed && !trackingByteCodeUpwardExposedUsed->IsEmpty())
    {
        // We don't need to track bytecodeUpwardExposeUses if we don't have bailout
        // We've collected the Backward bytecodeUpwardExposeUses for nothing, oh well.
        if (this->func->hasBailout)
        {
            BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = GetByteCodeRegisterUpwardExposed(block, func, this->tempAlloc);
            BVSparse<JitArenaAllocator>* notInDeadStore = trackingByteCodeUpwardExposedUsed->MinusNew(byteCodeUpwardExposedUsed, this->tempAlloc);

            if (!notInDeadStore->IsEmpty())
            {
                Output::Print(_u("\n\nByteCode Updward Exposed mismatch after DeadStore\n"));
                Output::Print(_u("Mismatch Instr:\n"));
                instr->Dump();
                Output::Print(_u("  ByteCode Register list present before Backward pass missing in DeadStore pass:\n"));
                FOREACH_BITSET_IN_SPARSEBV(bytecodeReg, notInDeadStore)
                {
                    Output::Print(_u("    R%u\n"), bytecodeReg);
                }
                NEXT_BITSET_IN_SPARSEBV;
                AssertMsg(false, "ByteCode Updward Exposed Used Mismatch");
            }
            JitAdelete(this->tempAlloc, notInDeadStore);
            JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
        }
    }
}